

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

Coin * AccessByTxid(CCoinsViewCache *view,Txid *txid)

{
  Coin *pCVar1;
  long in_FS_OFFSET;
  COutPoint local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(txid->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  local_48.n = 0;
  while ((pCVar1 = &coinEmpty, local_48.n < MAX_OUTPUTS_PER_BLOCK &&
         (pCVar1 = CCoinsViewCache::AccessCoin(view,&local_48), (pCVar1->out).nValue == -1))) {
    local_48.n = local_48.n + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pCVar1;
}

Assistant:

const Coin& AccessByTxid(const CCoinsViewCache& view, const Txid& txid)
{
    COutPoint iter(txid, 0);
    while (iter.n < MAX_OUTPUTS_PER_BLOCK) {
        const Coin& alternate = view.AccessCoin(iter);
        if (!alternate.IsSpent()) return alternate;
        ++iter.n;
    }
    return coinEmpty;
}